

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

bool __thiscall
duckdb_re2::Prog::SearchNFA
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int nsubmatch;
  bool bVar1;
  StringPiece *submatch;
  StringPiece sp;
  NFA nfa;
  StringPiece local_138;
  NFA local_120;
  
  NFA::NFA(&local_120,this);
  local_138.data_ = (const_pointer)0x0;
  local_138.size_ = 0;
  submatch = match;
  if (nmatch == 0) {
    submatch = &local_138;
  }
  nsubmatch = nmatch + (uint)(nmatch == 0);
  if (kind != kFullMatch) {
    nsubmatch = nmatch;
    submatch = match;
  }
  bVar1 = NFA::Search(&local_120,text,context,anchor == kAnchored || kind == kFullMatch,
                      kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch == 0) {
        match = &local_138;
      }
      if (submatch->data_ + match->size_ != text->data_ + text->size_) goto LAB_0185f348;
    }
    bVar1 = true;
  }
  else {
LAB_0185f348:
    bVar1 = false;
  }
  NFA::~NFA(&local_120);
  return bVar1;
}

Assistant:

bool
Prog::SearchNFA(const StringPiece& text, const StringPiece& context,
                Anchor anchor, MatchKind kind,
                StringPiece* match, int nmatch) {

  NFA nfa(this);
  StringPiece sp;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch == 0) {
      match = &sp;
      nmatch = 1;
    }
  }
  if (!nfa.Search(text, context, anchor == kAnchored, kind != kFirstMatch, match, nmatch))
    return false;
  if (kind == kFullMatch && EndPtr(match[0]) != EndPtr(text))
    return false;
  return true;
}